

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O3

insert_result * __thiscall
crnlib::
hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
::insert(insert_result *__return_storage_ptr__,
        hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
        *this,unsigned_long_long *k,empty_type *v)

{
  uint uVar1;
  unsigned_long_long uVar2;
  raw_node *prVar3;
  uint uVar4;
  raw_node *prVar5;
  uint new_hash_size;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  (__return_storage_ptr__->first).m_pTable = (hash_map_type *)0x0;
  (__return_storage_ptr__->first).m_index = 0;
  __return_storage_ptr__->second = false;
  uVar1 = (this->m_values).m_size;
  if (uVar1 == 0) {
LAB_0014db7a:
    new_hash_size = 4;
    if (4 < uVar1 * 2) {
      new_hash_size = uVar1 * 2;
    }
    rehash(this,new_hash_size);
    uVar1 = (this->m_values).m_size;
    if (uVar1 != 0) {
      uVar2 = *k;
      uVar4 = (uint)((int)uVar2 * -0x61c88647) >> ((byte)this->m_hash_shift & 0x1f);
      prVar3 = (this->m_values).m_p;
      prVar5 = prVar3 + uVar4;
      uVar7 = uVar4;
      if (prVar3[uVar4].m_bits[9] != '\0') {
        if (*(unsigned_long_long *)prVar5->m_bits == uVar2) goto LAB_0014dbc6;
        uVar6 = uVar1 - 1;
        do {
          bVar8 = uVar7 == 0;
          prVar5 = prVar5 + -1;
          uVar7 = uVar7 - 1;
          if (bVar8) {
            prVar5 = prVar3 + uVar6;
            uVar7 = uVar6;
          }
          if (uVar4 == uVar7) goto LAB_0014dc2b;
          if (prVar5->m_bits[9] == '\0') goto LAB_0014dc03;
        } while (*(unsigned_long_long *)prVar5->m_bits != uVar2);
        bVar8 = false;
        goto LAB_0014dc20;
      }
LAB_0014dc03:
      if (this->m_num_valid < this->m_grow_threshold) {
        *(unsigned_long_long *)prVar5->m_bits = uVar2;
        goto LAB_0014dc10;
      }
    }
LAB_0014dc2b:
    crnlib_fail("\"insert() failed\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_hash_map.h"
                ,0x15d);
  }
  else {
    uVar2 = *k;
    uVar4 = (uint)((int)uVar2 * -0x61c88647) >> ((byte)this->m_hash_shift & 0x1f);
    prVar3 = (this->m_values).m_p;
    prVar5 = prVar3 + uVar4;
    uVar7 = uVar4;
    if (prVar3[uVar4].m_bits[9] == '\0') {
LAB_0014db68:
      if (this->m_grow_threshold <= this->m_num_valid) goto LAB_0014db7a;
      *(unsigned_long_long *)prVar5->m_bits = uVar2;
LAB_0014dc10:
      *(empty_type *)(prVar5->m_bits + 8) = *v;
      prVar5->m_bits[9] = '\x01';
      this->m_num_valid = this->m_num_valid + 1;
      bVar8 = true;
    }
    else if (*(unsigned_long_long *)prVar5->m_bits == uVar2) {
LAB_0014dbc6:
      bVar8 = false;
    }
    else {
      do {
        bVar8 = uVar7 == 0;
        prVar5 = prVar5 + -1;
        uVar7 = uVar7 - 1;
        if (bVar8) {
          prVar5 = prVar3 + (uVar1 - 1);
          uVar7 = uVar1 - 1;
        }
        if (uVar4 == uVar7) goto LAB_0014db7a;
        if (prVar5->m_bits[9] == '\0') goto LAB_0014db68;
      } while (*(unsigned_long_long *)prVar5->m_bits != uVar2);
      bVar8 = false;
    }
LAB_0014dc20:
    (__return_storage_ptr__->first).m_pTable = this;
    (__return_storage_ptr__->first).m_index = uVar7;
    __return_storage_ptr__->second = bVar8;
  }
  return __return_storage_ptr__;
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value()) {
    insert_result result;
    if (!insert_no_grow(result, k, v)) {
      grow();

      // This must succeed.
      if (!insert_no_grow(result, k, v)) {
        CRNLIB_FAIL("insert() failed");
      }
    }

    return result;
  }